

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteFlat<long,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::VectorStringCastOperator<duckdb::IntCastToVarInt>>
               (long *ldata,string_t *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  idx_t iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  char *extraout_RDX;
  char *pcVar8;
  char *extraout_RDX_00;
  Vector *result;
  ulong uVar9;
  ulong uVar10;
  char **ppcVar11;
  idx_t iVar12;
  ulong uVar13;
  string_t sVar14;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    ppcVar11 = &(result_data->value).pointer.ptr;
    pcVar8 = (char *)count;
    for (iVar12 = 0; count != iVar12; iVar12 = iVar12 + 1) {
      sVar14 = IntToVarInt<long>((duckdb *)dataptr,(Vector *)ldata[iVar12],(long)pcVar8);
      pcVar8 = sVar14.value._8_8_;
      iVar4 = sVar14.value._0_8_;
      paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar11 + -1);
      paVar1->length = (int)iVar4;
      paVar1->prefix[0] = (char)(iVar4 >> 0x20);
      paVar1->prefix[1] = (char)(iVar4 >> 0x28);
      paVar1->prefix[2] = (char)(iVar4 >> 0x30);
      paVar1->prefix[3] = (char)(iVar4 >> 0x38);
      *ppcVar11 = pcVar8;
      ppcVar11 = ppcVar11 + 2;
    }
  }
  else {
    if (adds_nulls) {
      TemplatedValidityMask<unsigned_long>::Copy
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>,count);
      pcVar8 = extraout_RDX;
    }
    else {
      TemplatedValidityMask<unsigned_long>::Initialize
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>);
      pcVar8 = extraout_RDX_00;
    }
    uVar9 = 0;
    for (uVar7 = 0; uVar7 != count + 0x3f >> 6; uVar7 = uVar7 + 1) {
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar13 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar13 = count;
        }
LAB_00765164:
        ppcVar11 = &result_data[uVar9].value.pointer.ptr;
        for (; uVar6 = uVar9, uVar9 < uVar13; uVar9 = uVar9 + 1) {
          sVar14 = IntToVarInt<long>((duckdb *)dataptr,(Vector *)ldata[uVar9],(long)pcVar8);
          pcVar8 = sVar14.value._8_8_;
          lVar5 = sVar14.value._0_8_;
          paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar11 + -1);
          paVar1->length = (int)lVar5;
          paVar1->prefix[0] = (char)((ulong)lVar5 >> 0x20);
          paVar1->prefix[1] = (char)((ulong)lVar5 >> 0x28);
          paVar1->prefix[2] = (char)((ulong)lVar5 >> 0x30);
          paVar1->prefix[3] = (char)((ulong)lVar5 >> 0x38);
          *ppcVar11 = pcVar8;
          ppcVar11 = ppcVar11 + 2;
        }
      }
      else {
        uVar3 = puVar2[uVar7];
        uVar13 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar13 = count;
        }
        if (uVar3 == 0xffffffffffffffff) goto LAB_00765164;
        uVar6 = uVar13;
        if (uVar3 != 0) {
          ppcVar11 = &result_data[uVar9].value.pointer.ptr;
          for (uVar10 = 0; uVar6 = uVar10 + uVar9, uVar10 + uVar9 < uVar13; uVar10 = uVar10 + 1) {
            if ((uVar3 >> (uVar10 & 0x3f) & 1) != 0) {
              sVar14 = IntToVarInt<long>((duckdb *)dataptr,(Vector *)ldata[uVar9 + uVar10],
                                         (long)pcVar8);
              pcVar8 = sVar14.value._8_8_;
              lVar5 = sVar14.value._0_8_;
              paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar11 + -1);
              paVar1->length = (int)lVar5;
              paVar1->prefix[0] = (char)((ulong)lVar5 >> 0x20);
              paVar1->prefix[1] = (char)((ulong)lVar5 >> 0x28);
              paVar1->prefix[2] = (char)((ulong)lVar5 >> 0x30);
              paVar1->prefix[3] = (char)((ulong)lVar5 >> 0x38);
              *ppcVar11 = pcVar8;
            }
            ppcVar11 = ppcVar11 + 2;
          }
        }
      }
      uVar9 = uVar6;
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}